

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseAST.cpp
# Opt level: O0

size_t __thiscall antlr::BaseAST::getNumberOfChildren(BaseAST *this)

{
  BaseAST *other;
  BaseAST *pBVar1;
  size_t n;
  RefBaseAST t;
  ASTRefCount<antlr::BaseAST> *in_stack_ffffffffffffffb8;
  ASTRefCount *this_00;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  size_t local_20;
  ASTRefCount<antlr::BaseAST> local_18 [2];
  size_t local_8;
  
  this_00 = (ASTRefCount *)local_18;
  ASTRefCount<antlr::BaseAST>::ASTRefCount
            ((ASTRefCount<antlr::BaseAST> *)this_00,in_stack_ffffffffffffffb8);
  other = ASTRefCount::operator_cast_to_BaseAST_(this_00);
  if (other == (BaseAST *)0x0) {
    local_8 = 0;
  }
  else {
    local_20 = 1;
    while( true ) {
      pBVar1 = ASTRefCount<antlr::BaseAST>::operator->(local_18);
      pBVar1 = ASTRefCount::operator_cast_to_BaseAST_((ASTRefCount *)&pBVar1->right);
      if (pBVar1 == (BaseAST *)0x0) break;
      ASTRefCount<antlr::BaseAST>::operator->(local_18);
      ASTRefCount<antlr::BaseAST>::operator=
                ((ASTRefCount<antlr::BaseAST> *)
                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (ASTRefCount<antlr::BaseAST> *)other);
      local_20 = local_20 + 1;
    }
    local_8 = local_20;
  }
  ASTRefCount<antlr::BaseAST>::~ASTRefCount((ASTRefCount<antlr::BaseAST> *)this_00);
  return local_8;
}

Assistant:

size_t BaseAST::getNumberOfChildren() const
{
	RefBaseAST t = this->down;
	size_t n = 0;
	if( t )
	{
		n = 1;
		while( t->right )
		{
			t = t->right;
			n++;
		}
		return n;
	}
	return n;
}